

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O2

spv_result_t
spvtools::val::ValidateMemoryScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  spv_result_t sVar3;
  MemoryModel MVar4;
  char *pcVar5;
  Function *pFVar6;
  code *pcVar7;
  _Any_data *p_Var8;
  Op opcode;
  string local_288;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  string errorVUID;
  spv_result_t local_38;
  
  opcode = (Op)(inst->inst_).opcode;
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)&errorVUID,_,scope);
  sVar3 = ValidateScope(_,inst,scope);
  if (sVar3 != SPV_SUCCESS) {
    return sVar3;
  }
  if (errorVUID._M_dataplus._M_p._4_1_ == '\0') {
    return SPV_SUCCESS;
  }
  if ((uint)errorVUID._M_dataplus._M_p == 1) {
    bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVulkanMemoryModel)
    ;
    if ((!bVar2) ||
       (bVar2 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityVulkanMemoryModelDeviceScope), bVar2))
    goto LAB_0059b633;
    ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&errorVUID,
                    "Use of device scope with VulkanKHR memory model requires the ");
    pcVar5 = "VulkanMemoryModelDeviceScopeKHR capability";
  }
  else {
    if ((uint)errorVUID._M_dataplus._M_p != 5) {
LAB_0059b633:
      bVar2 = spvIsVulkanEnv(_->context_->target_env);
      if (!bVar2) {
        return SPV_SUCCESS;
      }
      if (((uint)errorVUID._M_dataplus._M_p < 7) &&
         ((0x5eU >> ((uint)errorVUID._M_dataplus._M_p & 0x1f) & 1) != 0)) {
        if (((uint)errorVUID._M_dataplus._M_p != 3) ||
           (_->context_->target_env != SPV_ENV_VULKAN_1_0)) {
          if ((uint)errorVUID._M_dataplus._M_p == 2) {
            ValidationState_t::VkErrorID_abi_cxx11_(&errorVUID,_,0x1c99,(char *)0x0);
            pFVar6 = ValidationState_t::function(_,inst->function_->id_);
            std::__cxx11::string::string((string *)&local_288,(string *)&errorVUID);
            local_248._8_8_ = 0;
            local_248._M_unused._M_object = ::operator_new(0x20);
            *(code **)local_248._M_unused._0_8_ = (code *)((long)local_248._M_unused._0_8_ + 0x10);
            paVar1 = &local_288.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p == paVar1) {
              *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
                   CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                            local_288.field_2._M_local_buf[0]);
              *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x18) = local_288.field_2._8_8_;
            }
            else {
              *(pointer *)local_248._M_unused._0_8_ = local_288._M_dataplus._M_p;
              *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
                   CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                            local_288.field_2._M_local_buf[0]);
            }
            *(size_type *)((long)local_248._M_unused._0_8_ + 8) = local_288._M_string_length;
            local_288._M_string_length = 0;
            local_288.field_2._M_local_buf[0] = '\0';
            local_230 = std::
                        _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_scopes.cpp:279:15)>
                        ::_M_invoke;
            local_238 = std::
                        _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_scopes.cpp:279:15)>
                        ::_M_manager;
            local_288._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::
            list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
            ::push_back(&pFVar6->execution_model_limitations_,(value_type *)&local_248);
            if (local_238 != (code *)0x0) {
              (*local_238)(&local_248,&local_248,__destroy_functor);
            }
            std::__cxx11::string::_M_dispose();
            MVar4 = ValidationState_t::memory_model(_);
            if (MVar4 != GLSL450) goto LAB_0059baba;
            ValidationState_t::VkErrorID_abi_cxx11_(&local_288,_,0x1c98,(char *)0x0);
            std::__cxx11::string::operator=((string *)&errorVUID,(string *)&local_288);
            std::__cxx11::string::_M_dispose();
            pFVar6 = ValidationState_t::function(_,inst->function_->id_);
            std::__cxx11::string::string((string *)&local_288,(string *)&errorVUID);
            local_268._8_8_ = 0;
            local_268._M_unused._M_object = ::operator_new(0x20);
            *(code **)local_268._M_unused._0_8_ = (code *)((long)local_268._M_unused._0_8_ + 0x10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p == paVar1) {
              *(long *)((long)local_268._M_unused._0_8_ + 0x10) =
                   CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                            local_288.field_2._M_local_buf[0]);
              *(undefined8 *)((long)local_268._M_unused._0_8_ + 0x18) = local_288.field_2._8_8_;
            }
            else {
              *(pointer *)local_268._M_unused._0_8_ = local_288._M_dataplus._M_p;
              *(long *)((long)local_268._M_unused._0_8_ + 0x10) =
                   CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                            local_288.field_2._M_local_buf[0]);
            }
            *(size_type *)((long)local_268._M_unused._0_8_ + 8) = local_288._M_string_length;
            local_288._M_string_length = 0;
            local_288.field_2._M_local_buf[0] = '\0';
            local_250 = std::
                        _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_scopes.cpp:301:17)>
                        ::_M_invoke;
            local_258 = std::
                        _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_scopes.cpp:301:17)>
                        ::_M_manager;
            local_288._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::
            list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
            ::push_back(&pFVar6->execution_model_limitations_,(value_type *)&local_268);
            if (local_258 != (code *)0x0) {
              p_Var8 = &local_268;
              pcVar7 = local_258;
              goto LAB_0059baa8;
            }
          }
          else {
            if ((uint)errorVUID._M_dataplus._M_p != 6) {
              return SPV_SUCCESS;
            }
            ValidationState_t::VkErrorID_abi_cxx11_(&errorVUID,_,0x1220,(char *)0x0);
            pFVar6 = ValidationState_t::function(_,inst->function_->id_);
            std::__cxx11::string::string((string *)&local_288,(string *)&errorVUID);
            local_228._8_8_ = 0;
            local_228._M_unused._M_object = ::operator_new(0x20);
            *(code **)local_228._M_unused._0_8_ = (code *)((long)local_228._M_unused._0_8_ + 0x10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p == &local_288.field_2) {
              *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
                   CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                            local_288.field_2._M_local_buf[0]);
              *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x18) = local_288.field_2._8_8_;
            }
            else {
              *(pointer *)local_228._M_unused._0_8_ = local_288._M_dataplus._M_p;
              *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
                   CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                            local_288.field_2._M_local_buf[0]);
            }
            *(size_type *)((long)local_228._M_unused._0_8_ + 8) = local_288._M_string_length;
            local_288._M_string_length = 0;
            local_288.field_2._M_local_buf[0] = '\0';
            local_210 = std::
                        _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_scopes.cpp:256:15)>
                        ::_M_invoke;
            local_218 = std::
                        _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_scopes.cpp:256:15)>
                        ::_M_manager;
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            std::__cxx11::
            list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
            ::push_back(&pFVar6->execution_model_limitations_,(value_type *)&local_228);
            if (local_218 != (code *)0x0) {
              p_Var8 = &local_228;
              pcVar7 = local_218;
LAB_0059baa8:
              (*pcVar7)(p_Var8,p_Var8,__destroy_functor);
            }
          }
          std::__cxx11::string::_M_dispose();
LAB_0059baba:
          std::__cxx11::string::_M_dispose();
          return SPV_SUCCESS;
        }
        bVar2 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilitySubgroupBallotKHR);
        if (bVar2) {
          return SPV_SUCCESS;
        }
        bVar2 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilitySubgroupVoteKHR);
        if (bVar2) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_288,_,0x1f0f,(char *)0x0);
        std::operator<<((ostream *)&errorVUID,(string *)&local_288);
        pcVar5 = spvOpcodeString(opcode);
        std::operator<<((ostream *)&errorVUID,pcVar5);
        std::operator<<((ostream *)&errorVUID,
                        ": in Vulkan 1.0 environment Memory Scope is can not be Subgroup without SubgroupBallotKHR or SubgroupVoteKHR declared"
                       );
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_288,_,0x121e,(char *)0x0);
        std::operator<<((ostream *)&errorVUID,(string *)&local_288);
        pcVar5 = spvOpcodeString(opcode);
        std::operator<<((ostream *)&errorVUID,pcVar5);
        std::operator<<((ostream *)&errorVUID,
                        ": in Vulkan environment Memory Scope is limited to Device, QueueFamily, Workgroup, ShaderCallKHR, Subgroup, or Invocation"
                       );
      }
      std::__cxx11::string::_M_dispose();
      goto LAB_0059b854;
    }
    bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVulkanMemoryModel)
    ;
    if (bVar2) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar5 = spvOpcodeString(opcode);
    std::operator<<((ostream *)&errorVUID,pcVar5);
    std::operator<<((ostream *)&errorVUID,": Memory Scope QueueFamilyKHR requires capability ");
    pcVar5 = "VulkanMemoryModelKHR";
  }
  std::operator<<((ostream *)&errorVUID,pcVar5);
LAB_0059b854:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
  return local_38;
}

Assistant:

spv_result_t ValidateMemoryScope(ValidationState_t& _, const Instruction* inst,
                                 uint32_t scope) {
  const spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t tmp_value = 0;
  std::tie(is_int32, is_const_int32, tmp_value) = _.EvalInt32IfConst(scope);

  if (auto error = ValidateScope(_, inst, scope)) {
    return error;
  }

  if (!is_const_int32) {
    return SPV_SUCCESS;
  }

  spv::Scope value = spv::Scope(tmp_value);

  if (value == spv::Scope::QueueFamilyKHR) {
    if (_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
      return SPV_SUCCESS;
    } else {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << spvOpcodeString(opcode)
             << ": Memory Scope QueueFamilyKHR requires capability "
             << "VulkanMemoryModelKHR";
    }
  }

  if (value == spv::Scope::Device &&
      _.HasCapability(spv::Capability::VulkanMemoryModelKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelDeviceScopeKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Use of device scope with VulkanKHR memory model requires the "
           << "VulkanMemoryModelDeviceScopeKHR capability";
  }

  // Vulkan Specific rules
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (value != spv::Scope::Device && value != spv::Scope::Workgroup &&
        value != spv::Scope::Subgroup && value != spv::Scope::Invocation &&
        value != spv::Scope::ShaderCallKHR &&
        value != spv::Scope::QueueFamily) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4638) << spvOpcodeString(opcode)
             << ": in Vulkan environment Memory Scope is limited to Device, "
                "QueueFamily, Workgroup, ShaderCallKHR, Subgroup, or "
                "Invocation";
    } else if (_.context()->target_env == SPV_ENV_VULKAN_1_0 &&
               value == spv::Scope::Subgroup &&
               !_.HasCapability(spv::Capability::SubgroupBallotKHR) &&
               !_.HasCapability(spv::Capability::SubgroupVoteKHR)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(7951) << spvOpcodeString(opcode)
             << ": in Vulkan 1.0 environment Memory Scope is can not be "
                "Subgroup without SubgroupBallotKHR or SubgroupVoteKHR "
                "declared";
    }

    if (value == spv::Scope::ShaderCallKHR) {
      std::string errorVUID = _.VkErrorID(4640);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR &&
                    model != spv::ExecutionModel::IntersectionKHR &&
                    model != spv::ExecutionModel::AnyHitKHR &&
                    model != spv::ExecutionModel::ClosestHitKHR &&
                    model != spv::ExecutionModel::MissKHR &&
                    model != spv::ExecutionModel::CallableKHR) {
                  if (message) {
                    *message =
                        errorVUID +
                        "ShaderCallKHR Memory Scope requires a ray tracing "
                        "execution model";
                  }
                  return false;
                }
                return true;
              });
    }

    if (value == spv::Scope::Workgroup) {
      std::string errorVUID = _.VkErrorID(7321);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::GLCompute &&
                    model != spv::ExecutionModel::TessellationControl &&
                    model != spv::ExecutionModel::TaskNV &&
                    model != spv::ExecutionModel::MeshNV &&
                    model != spv::ExecutionModel::TaskEXT &&
                    model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message = errorVUID +
                               "Workgroup Memory Scope is limited to MeshNV, "
                               "TaskNV, MeshEXT, TaskEXT, TessellationControl, "
                               "and GLCompute execution model";
                  }
                  return false;
                }
                return true;
              });

      if (_.memory_model() == spv::MemoryModel::GLSL450) {
        errorVUID = _.VkErrorID(7320);
        _.function(inst->function()->id())
            ->RegisterExecutionModelLimitation(
                [errorVUID](spv::ExecutionModel model, std::string* message) {
                  if (model == spv::ExecutionModel::TessellationControl) {
                    if (message) {
                      *message =
                          errorVUID +
                          "Workgroup Memory Scope can't be used with "
                          "TessellationControl using GLSL450 Memory Model";
                    }
                    return false;
                  }
                  return true;
                });
      }
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  return SPV_SUCCESS;
}